

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZOneShapeRestraint.h
# Opt level: O1

void __thiscall TPZOneShapeRestraint::Write(TPZOneShapeRestraint *this,TPZStream *buf)

{
  pair<long,_int> *ppVar1;
  long lVar2;
  TPZManVector<int,_4> faces;
  TPZManVector<long,_4> seqnums;
  TPZVec<int> local_a0;
  int local_80 [4];
  TPZVec<long> local_70;
  long local_50 [4];
  
  TPZVec<long>::TPZVec(&local_70,0);
  local_70._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a0548;
  local_70.fNElements = 4;
  local_70.fNAlloc = 0;
  local_70.fStore = local_50;
  TPZVec<int>::TPZVec(&local_a0,0);
  local_a0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e5370;
  local_a0.fNElements = 4;
  local_a0.fNAlloc = 0;
  ppVar1 = (this->fFaces).super_TPZVec<std::pair<long,_int>_>.fStore;
  lVar2 = 0x10;
  do {
    *(long *)((long)local_70.fStore + lVar2 * 4 + -0x40) = (&ppVar1[-8].first)[lVar2];
    *(undefined4 *)((long)&local_a0._vptr_TPZVec + lVar2 * 2) =
         *(undefined4 *)((long)ppVar1 + lVar2 * 8 + -0x78);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x18);
  local_a0.fStore = local_80;
  (*buf->_vptr_TPZStream[5])(buf,local_70.fStore,4);
  (*buf->_vptr_TPZStream[3])(buf,local_a0.fStore,4);
  (*buf->_vptr_TPZStream[3])(buf,(this->fOrient).super_TPZVec<int>.fStore,4);
  if (local_a0.fStore == local_80) {
    local_a0.fStore = (int *)0x0;
  }
  local_a0.fNAlloc = 0;
  local_a0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_a0.fStore != (int *)0x0) {
    operator_delete__(local_a0.fStore);
  }
  if (local_70.fStore == local_50) {
    local_70.fStore = (long *)0x0;
  }
  local_70.fNAlloc = 0;
  local_70._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_70.fStore != (long *)0x0) {
    operator_delete__(local_70.fStore);
  }
  return;
}

Assistant:

void Write(TPZStream &buf) const
    {
        TPZManVector<int64_t,4> seqnums(4);
        TPZManVector<int,4> faces(4);
        for (int i=0; i<4; i++)
        {
            seqnums[i] = fFaces[i].first;
            faces[i] = fFaces[i].second;
        }
        buf.Write(&seqnums[0],4);
        buf.Write(&faces[0],4);
        buf.Write(&fOrient[0],4);
    }